

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.cpp
# Opt level: O0

uint __thiscall IZDeflate::bi_reverse(IZDeflate *this,uint code,int len)

{
  uint uVar1;
  uint uVar2;
  undefined4 local_1c;
  undefined4 local_18;
  uint res;
  int len_local;
  uint code_local;
  IZDeflate *this_local;
  
  local_1c = 0;
  uVar1 = local_1c;
  local_18 = len;
  res = code;
  do {
    local_1c = uVar1;
    uVar2 = res & 1;
    res = res >> 1;
    local_18 = local_18 + -1;
    uVar1 = (uVar2 | local_1c) << 1;
  } while (0 < local_18);
  return uVar2 | local_1c & 0x7fffffff;
}

Assistant:

unsigned IZDeflate::bi_reverse(unsigned code, int len)
    // unsigned code; /* the value to invert */
    // int len;       /* its bit length */
{
    unsigned res = 0;
    do {
        res |= code & 1;
        code >>= 1, res <<= 1;
    } while (--len > 0);
    return res >> 1;
}